

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexCut.c
# Opt level: O3

Gia_Man_t *
Bmc_GiaGenerateGiaAllOne(Gia_Man_t *p,Abc_Cex_t *pCex,Vec_Bit_t **pvInits,int iFrBeg,int iFrEnd)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  bool bVar6;
  Vec_Bit_t *pVVar7;
  int *__s;
  Gia_Man_t *p_00;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *pGVar10;
  int iVar11;
  ulong uVar12;
  Vec_Int_t *pVVar13;
  char *pcVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  char *__assertion;
  uint uVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  size_t sVar25;
  uint local_54;
  
  Gia_ManCleanMark0(p);
  uVar22 = p->nRegs;
  if ((int)uVar22 < 1) {
    local_54 = 0;
  }
  else {
    uVar12 = 0;
    do {
      iVar24 = p->vCis->nSize;
      local_54 = (uint)uVar12;
      uVar15 = (iVar24 - uVar22) + local_54;
      if (((int)uVar15 < 0) || (iVar24 <= (int)uVar15)) goto LAB_0057f8b5;
      iVar24 = p->vCis->pArray[uVar15];
      lVar17 = (long)iVar24;
      if ((lVar17 < 0) || (p->nObjs <= iVar24)) goto LAB_0057f896;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      local_54 = local_54 + 1;
      *(ulong *)(pGVar4 + lVar17) =
           *(ulong *)(pGVar4 + lVar17) & 0xffffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[uVar12 >> 5] >> ((byte)uVar12 & 0x1f) & 1) << 0x1e);
      uVar22 = p->nRegs;
      uVar12 = (ulong)local_54;
    } while ((int)local_54 < (int)uVar22);
  }
  iVar24 = (((int)uVar22 >> 5) + 1) - (uint)((uVar22 & 0x1f) == 0);
  pVVar7 = (Vec_Bit_t *)malloc(0x10);
  pVVar7->nCap = iVar24 * 0x20;
  if (iVar24 == 0) {
    sVar25 = 0;
    __s = (int *)0x0;
  }
  else {
    sVar25 = (long)iVar24 << 2;
    __s = (int *)malloc(sVar25);
  }
  pVVar7->pArray = __s;
  pVVar7->nSize = iVar24 * 0x20;
  iVar24 = 0;
  memset(__s,0,sVar25);
  *pvInits = pVVar7;
  if (iFrEnd < 1) {
    if (iFrEnd != 0) {
      __assert_fail("i == iFrEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                    ,0x18a,
                    "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                   );
    }
  }
  else {
    do {
      if (iVar24 == iFrBeg) {
        pVVar13 = p->vCis;
        if (0 < (int)uVar22) {
          uVar15 = 0;
          do {
            uVar18 = (pVVar13->nSize - uVar22) + uVar15;
            if (((int)uVar18 < 0) || (pVVar13->nSize <= (int)uVar18)) goto LAB_0057f8b5;
            iVar11 = pVVar13->pArray[uVar18];
            if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_0057f896;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            if ((p->pObjs[iVar11].field_0x3 & 0x40) != 0) {
              if ((*pvInits)->nSize <= (int)uVar15) {
                __assertion = "i >= 0 && i < p->nSize";
                pcVar8 = 
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                ;
                pcVar14 = "void Vec_BitWriteEntry(Vec_Bit_t *, int, int)";
                goto LAB_0057f908;
              }
              puVar1 = (uint *)((*pvInits)->pArray + (uVar15 >> 5));
              *puVar1 = *puVar1 | 1 << ((byte)uVar15 & 0x1f);
              uVar22 = p->nRegs;
            }
            uVar15 = uVar15 + 1;
          } while ((int)uVar15 < (int)uVar22);
        }
      }
      else {
        pVVar13 = p->vCis;
      }
      uVar12 = (ulong)(uint)pVVar13->nSize;
      if ((int)uVar22 < pVVar13->nSize) {
        lVar17 = 0;
        do {
          if ((int)uVar12 <= lVar17) goto LAB_0057f8b5;
          lVar23 = (long)pVVar13->pArray[lVar17];
          if ((lVar23 < 0) || (iVar11 = p->nObjs, iVar11 <= pVVar13->pArray[lVar17]))
          goto LAB_0057f896;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) {
            local_54 = local_54 + (int)lVar17;
            goto LAB_0057f098;
          }
          *(ulong *)(pGVar4 + lVar23) =
               *(ulong *)(pGVar4 + lVar23) & 0xffffffffbfffffff |
               (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_54 + lVar17) >> 5] >>
                        ((byte)((ulong)local_54 + lVar17) & 0x1f) & 1) << 0x1e);
          lVar17 = lVar17 + 1;
          pVVar13 = p->vCis;
          uVar12 = (ulong)pVVar13->nSize;
        } while (lVar17 < (long)(uVar12 - (long)p->nRegs));
        local_54 = local_54 + (int)lVar17;
      }
      iVar11 = p->nObjs;
      if (0 < iVar11) {
LAB_0057f098:
        lVar17 = 0;
        lVar23 = 0;
        do {
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar12 = *(ulong *)(&pGVar4->field_0x0 + lVar17);
          if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
            *(ulong *)(&pGVar4->field_0x0 + lVar17) =
                 uVar12 & 0xffffffff3fffffff |
                 (ulong)((((uint)(uVar12 >> 0x3d) ^
                          *(uint *)((long)pGVar4 +
                                   (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3 + lVar17) >>
                          0x1e) & ((uint)(uVar12 >> 0x1d) & 7 ^
                                  *(uint *)((long)pGVar4 +
                                           (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3 +
                                           lVar17) >> 0x1e) & 1) << 0x1e);
            iVar11 = p->nObjs;
          }
          lVar23 = lVar23 + 1;
          lVar17 = lVar17 + 0xc;
        } while (lVar23 < iVar11);
      }
      pVVar13 = p->vCos;
      if (0 < pVVar13->nSize) {
        lVar17 = 0;
        do {
          iVar11 = pVVar13->pArray[lVar17];
          if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_0057f896;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar11;
          uVar22 = (uint)*(ulong *)pGVar4;
          *(ulong *)pGVar4 =
               *(ulong *)pGVar4 & 0xffffffffbfffffff |
               (ulong)((uVar22 * 2 ^ *(uint *)(pGVar4 + -(ulong)(uVar22 & 0x1fffffff))) & 0x40000000
                      );
          lVar17 = lVar17 + 1;
          pVVar13 = p->vCos;
        } while (lVar17 < pVVar13->nSize);
      }
      uVar22 = p->nRegs;
      if (0 < (int)uVar22) {
        iVar11 = 0;
        do {
          iVar2 = p->vCos->nSize;
          uVar15 = (iVar2 - uVar22) + iVar11;
          if (((int)uVar15 < 0) || (iVar2 <= (int)uVar15)) goto LAB_0057f8b5;
          iVar2 = p->vCos->pArray[uVar15];
          if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0057f896;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          iVar3 = p->vCis->nSize;
          uVar22 = (iVar3 - uVar22) + iVar11;
          if (((int)uVar22 < 0) || (iVar3 <= (int)uVar22)) goto LAB_0057f8b5;
          uVar22 = p->vCis->pArray[uVar22];
          lVar17 = (long)(int)uVar22;
          if ((lVar17 < 0) || ((uint)p->nObjs <= uVar22)) goto LAB_0057f896;
          *(ulong *)(pGVar4 + lVar17) =
               *(ulong *)(pGVar4 + lVar17) & 0xffffffffbfffffff |
               (ulong)((uint)*(undefined8 *)(pGVar4 + iVar2) & 0x40000000);
          iVar11 = iVar11 + 1;
          uVar22 = p->nRegs;
        } while (iVar11 < (int)uVar22);
      }
      iVar24 = iVar24 + 1;
    } while (iVar24 != iFrEnd);
  }
  p_00 = Gia_ManStart(10000);
  pcVar14 = p->pName;
  if (pcVar14 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar25 = strlen(pcVar14);
    pcVar8 = (char *)malloc(sVar25 + 1);
    strcpy(pcVar8,pcVar14);
  }
  p_00->pName = pcVar8;
  pGVar4 = p->pObjs;
  pGVar4->Value = 1;
  iVar24 = p->nRegs;
  pVVar13 = p->vCis;
  uVar22 = pVVar13->nSize;
  if (uVar22 - iVar24 != 0 && iVar24 <= (int)uVar22) {
    uVar20 = 0;
    uVar12 = (ulong)uVar22;
    if ((int)uVar22 < 1) {
      uVar12 = uVar20;
    }
    do {
      if (uVar12 == uVar20) goto LAB_0057f8b5;
      iVar11 = pVVar13->pArray[uVar20];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_0057f896;
      pGVar4[iVar11].Value = 1;
      uVar20 = uVar20 + 1;
    } while (uVar22 - iVar24 != uVar20);
  }
  if (0 < iVar24) {
    iVar11 = 0;
    do {
      iVar2 = p->vCis->nSize;
      uVar22 = (iVar2 - iVar24) + iVar11;
      if (((int)uVar22 < 0) || (iVar2 <= (int)uVar22)) goto LAB_0057f8b5;
      iVar24 = p->vCis->pArray[uVar22];
      if (((long)iVar24 < 0) || (p->nObjs <= iVar24)) goto LAB_0057f896;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_00->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) {
LAB_0057f931:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar9 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar9)) goto LAB_0057f931;
      uVar22 = (int)((ulong)((long)pGVar9 - (long)pGVar5) >> 2) * 0x55555556;
      if ((int)uVar22 < 0) {
        __assertion = "Lit >= 0";
        pcVar8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
        ;
        pcVar14 = "int Abc_LitNotCond(int, int)";
LAB_0057f908:
        __assert_fail(__assertion,pcVar8,0x132,pcVar14);
      }
      pGVar4 = pGVar4 + iVar24;
      pGVar4->Value = uVar22 | (*(uint *)pGVar4 >> 0x1e & 1) == 0;
      iVar11 = iVar11 + 1;
      iVar24 = p->nRegs;
    } while (iVar11 < iVar24);
  }
  Gia_ManHashStart(p_00);
  if (pCex->iFrame < iFrEnd) {
LAB_0057f80f:
    Gia_ManHashStop(p_00);
    if (local_54 != pCex->nBits) {
      __assert_fail("iBit == pCex->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                    ,0x1b8,
                    "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                   );
    }
    uVar22 = pCex->iPo;
    iVar24 = p->vCos->nSize;
    if (iVar24 - p->nRegs <= (int)uVar22) {
      __assert_fail("v < Gia_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
    }
    if ((-1 < (int)uVar22) && ((int)uVar22 < iVar24)) {
      iVar24 = p->vCos->pArray[uVar22];
      if ((-1 < (long)iVar24) && (iVar24 < p->nObjs)) {
        Gia_ManAppendCo(p_00,p->pObjs[iVar24].Value);
        pGVar10 = Gia_ManCleanup(p_00);
        Gia_ManStop(p_00);
        return pGVar10;
      }
LAB_0057f896:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
LAB_0057f8b5:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar24 = p->nRegs;
  do {
    pVVar13 = p->vCis;
    uVar12 = (ulong)(uint)pVVar13->nSize;
    if (iVar24 < pVVar13->nSize) {
      lVar17 = 0;
      do {
        if ((int)uVar12 <= lVar17) goto LAB_0057f8b5;
        lVar23 = (long)pVVar13->pArray[lVar17];
        if ((lVar23 < 0) || (iVar24 = p->nObjs, iVar24 <= pVVar13->pArray[lVar17]))
        goto LAB_0057f896;
        pGVar4 = p->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) {
          local_54 = local_54 + (int)lVar17;
          goto LAB_0057f535;
        }
        *(ulong *)(pGVar4 + lVar23) =
             *(ulong *)(pGVar4 + lVar23) & 0xffffffffbfffffff |
             (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)local_54 + lVar17) >> 5] >>
                      ((byte)((ulong)local_54 + lVar17) & 0x1f) & 1) << 0x1e);
        lVar17 = lVar17 + 1;
        pVVar13 = p->vCis;
        uVar12 = (ulong)pVVar13->nSize;
      } while (lVar17 < (long)(uVar12 - (long)p->nRegs));
      local_54 = local_54 + (int)lVar17;
    }
    iVar24 = p->nObjs;
    if (0 < iVar24) {
LAB_0057f535:
      lVar23 = 8;
      lVar17 = 0;
      do {
        pGVar4 = p->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        uVar12 = *(ulong *)((long)pGVar4 + lVar23 + -8);
        if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
          uVar22 = (uint)(uVar12 & 0x1fffffff);
          uVar16 = (uint)(uVar12 >> 0x1d) & 7 ^
                   *(uint *)((long)pGVar4 + (ulong)(uVar22 * 4) * -3 + lVar23 + -8) >> 0x1e;
          uVar15 = (uint)(uVar12 >> 0x20);
          uVar18 = uVar15 & 0x1fffffff;
          uVar19 = *(uint *)((long)pGVar4 + (ulong)(uVar18 * 4) * -3 + lVar23 + -8) >> 0x1e & 1;
          uVar15 = uVar15 >> 0x1d & 1;
          uVar21 = (uVar19 ^ uVar15) & uVar16;
          *(ulong *)((long)pGVar4 + lVar23 + -8) =
               uVar12 & 0xffffffff3fffffff | (ulong)(uVar21 << 0x1e);
          if (uVar21 == 0) {
            if (((uVar16 & 1) == 0) && (uVar19 == uVar15)) {
              iVar24 = Gia_ManHashOr(p_00,*(int *)((long)pGVar4 + lVar23 + (ulong)(uVar22 << 2) * -3
                                                  ),
                                     *(int *)((long)pGVar4 + lVar23 + (ulong)(uVar18 << 2) * -3));
            }
            else {
              if (((uVar16 & 1) != 0) && (uVar22 = uVar18, uVar19 != uVar15)) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                              ,0x1a6,
                              "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                             );
              }
              iVar24 = *(int *)((long)pGVar4 + lVar23 + (ulong)(uVar22 << 2) * -3);
            }
          }
          else {
            iVar24 = Gia_ManHashAnd(p_00,*(int *)((long)pGVar4 + lVar23 + (ulong)(uVar22 << 2) * -3)
                                    ,*(int *)((long)pGVar4 + lVar23 + (ulong)(uVar18 << 2) * -3));
          }
          *(int *)(&pGVar4->field_0x0 + lVar23) = iVar24;
          if (iVar24 == 0) {
            __assert_fail("pObj->Value > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                          ,0x1a7,
                          "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                         );
          }
          iVar24 = p->nObjs;
        }
        lVar17 = lVar17 + 1;
        lVar23 = lVar23 + 0xc;
      } while (lVar17 < iVar24);
    }
    pVVar13 = p->vCos;
    if (0 < pVVar13->nSize) {
      lVar17 = 0;
      do {
        iVar24 = pVVar13->pArray[lVar17];
        if (((long)iVar24 < 0) || (p->nObjs <= iVar24)) goto LAB_0057f896;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar4 = p->pObjs + iVar24;
        uVar22 = (uint)*(ulong *)pGVar4;
        uVar12 = (ulong)(uVar22 & 0x1fffffff);
        *(ulong *)pGVar4 =
             *(ulong *)pGVar4 & 0xffffffffbfffffff |
             (ulong)((uVar22 * 2 ^ *(uint *)(pGVar4 + -uVar12)) & 0x40000000);
        uVar22 = pGVar4[-uVar12].Value;
        pGVar4->Value = uVar22;
        if (uVar22 == 0) {
          __assert_fail("pObj->Value > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcCexCut.c"
                        ,0x1ad,
                        "Gia_Man_t *Bmc_GiaGenerateGiaAllOne(Gia_Man_t *, Abc_Cex_t *, Vec_Bit_t **, int, int)"
                       );
        }
        lVar17 = lVar17 + 1;
        pVVar13 = p->vCos;
      } while (lVar17 < pVVar13->nSize);
    }
    iVar11 = pCex->iFrame;
    if (iFrEnd == iVar11) goto LAB_0057f80f;
    iVar24 = p->nRegs;
    if (0 < iVar24) {
      iVar11 = 0;
      do {
        iVar2 = p->vCos->nSize;
        uVar22 = (iVar2 - iVar24) + iVar11;
        if (((int)uVar22 < 0) || (iVar2 <= (int)uVar22)) goto LAB_0057f8b5;
        iVar2 = p->vCos->pArray[uVar22];
        if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_0057f896;
        pGVar4 = p->pObjs;
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        iVar3 = p->vCis->nSize;
        uVar22 = (iVar3 - iVar24) + iVar11;
        if (((int)uVar22 < 0) || (iVar3 <= (int)uVar22)) goto LAB_0057f8b5;
        uVar22 = p->vCis->pArray[uVar22];
        lVar17 = (long)(int)uVar22;
        if ((lVar17 < 0) || ((uint)p->nObjs <= uVar22)) goto LAB_0057f896;
        *(ulong *)(pGVar4 + lVar17) =
             *(ulong *)(pGVar4 + lVar17) & 0xffffffffbfffffff |
             (ulong)((uint)*(undefined8 *)(pGVar4 + iVar2) & 0x40000000);
        pGVar4[lVar17].Value = pGVar4[iVar2].Value;
        iVar11 = iVar11 + 1;
        iVar24 = p->nRegs;
      } while (iVar11 < iVar24);
      iVar11 = pCex->iFrame;
    }
    bVar6 = iVar11 <= iFrEnd;
    iFrEnd = iFrEnd + 1;
    if (bVar6) goto LAB_0057f80f;
  } while( true );
}

Assistant:

Gia_Man_t * Bmc_GiaGenerateGiaAllOne( Gia_Man_t * p, Abc_Cex_t * pCex, Vec_Bit_t ** pvInits, int iFrBeg, int iFrEnd )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int i, k, iBit = 0, fCompl0, fCompl1;

    // skip trough the first iFrEnd frames
    Gia_ManCleanMark0(p);
    Gia_ManForEachRo( p, pObj, k )
        pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
    *pvInits = Vec_BitStart( Gia_ManRegNum(p) );
    for ( i = 0; i < iFrEnd; i++ )
    {
        // remember values in frame iFrBeg
        if ( i == iFrBeg )
            Gia_ManForEachRo( p, pObjRo, k )
                if ( pObjRo->fMark0 )
                    Vec_BitWriteEntry( *pvInits, k, 1 );
        // simulate other values
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
            pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                           (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
        Gia_ManForEachCo( p, pObj, k )
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
            pObjRo->fMark0 = pObjRi->fMark0;
    }
    assert( i == iFrEnd );

    // create new AIG manager
    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManConst0(p)->Value = 1;
    Gia_ManForEachPi( p, pObj, k )
        pObj->Value = 1;
    Gia_ManForEachRo( p, pObjRo, k )
        pObjRo->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), !pObjRo->fMark0 );
    Gia_ManHashStart( pNew );
    for ( i = iFrEnd; i <= pCex->iFrame; i++ )
    {
        Gia_ManForEachPi( p, pObj, k )
            pObj->fMark0 = Abc_InfoHasBit(pCex->pData, iBit++);
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 && !fCompl1 )
                pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( !fCompl1 )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
            assert( pObj->Value > 0 );
        }
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->Value = Gia_ObjFanin0(pObj)->Value;
            assert( pObj->Value > 0 );
        } 
        if ( i == pCex->iFrame )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->Value = pObjRi->Value;
        }
    }
    Gia_ManHashStop( pNew );
    assert( iBit == pCex->nBits );

    // create PO
    Gia_ManAppendCo( pNew, Gia_ManPo(p, pCex->iPo)->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}